

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS
ref_facelift_edge_face_uv
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  double dVar1;
  REF_GEOM ref_geom;
  bool bVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  REF_CELL ref_cell;
  char *pcVar9;
  REF_DBL *bary_00;
  REF_INT cell_00;
  REF_INT *pRVar10;
  REF_DBL *bary_01;
  REF_INT ncell;
  REF_INT cell;
  REF_DBL faceuv [2];
  REF_INT cells [2];
  REF_INT tuv_sense;
  REF_DBL bary [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  int local_22c;
  REF_DBL *local_228;
  int local_21c;
  undefined8 local_218;
  double dStack_210;
  REF_FACELIFT local_200;
  REF_DBL local_1f8;
  REF_INT local_1f0 [2];
  REF_DBL local_1e8;
  REF_DBL local_1e0 [3];
  REF_DBL local_1c8;
  REF_DBL local_1c0 [2];
  REF_INT local_1ac;
  REF_DBL local_1a8 [4];
  REF_INT local_188;
  REF_INT local_184 [27];
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  
  ref_geom = ref_facelift->grid->geom;
  local_1f8 = t;
  uVar3 = ref_egads_edge_face_uv(ref_geom,edgeid,faceid,sense,t,uv);
  if (uVar3 == 0) {
    if (sense != 0) {
      return 0;
    }
    if (ref_facelift->displacement != (REF_DBL *)0x0) {
      return 0;
    }
    local_228 = uv;
    local_200 = ref_facelift;
    uVar3 = ref_facelift_enclosing(ref_facelift,1,edgeid,&local_1f8,&local_21c,local_1a8);
    if (uVar3 == 0) {
      if (local_21c == -1) {
        pcVar9 = "no enclosing found";
        uVar5 = 0x372;
        goto LAB_001aff06;
      }
      bary_01 = &local_1c8;
      uVar3 = ref_node_clip_bary2(local_1a8,bary_01);
      if (uVar3 == 0) {
        bary_00 = &local_1e8;
        uVar3 = ref_node_clip_bary2(local_1a8,bary_00);
        if (uVar3 == 0) {
          uVar3 = ref_cell_nodes(ref_facelift->edg_cell,local_21c,&local_188);
          if (uVar3 == 0) {
            uVar3 = ref_cell_list_with2(ref_facelift->tri_cell,local_188,local_184[0],2,&local_22c,
                                        local_1f0);
            if (uVar3 == 0) {
              if (local_22c < 1) {
                pcVar9 = "no tri found for edg";
                uVar5 = 0x37a;
LAB_001aff06:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,uVar5,"ref_facelift_edge_face_uv",pcVar9);
                return 1;
              }
              ref_cell = ref_facelift->tri_cell;
              cell_00 = -1;
              lVar7 = 0;
              do {
                uVar3 = ref_cell_nodes(ref_cell,local_1f0[lVar7],(REF_INT *)&local_118);
                if (uVar3 != 0) {
                  pcVar9 = "tri nodes";
                  uVar5 = 0x37e;
                  goto LAB_001afe05;
                }
                ref_cell = ref_facelift->tri_cell;
                if (*(int *)((long)&local_118 + (long)ref_cell->node_per * 4) == faceid) {
                  if (cell_00 != -1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x381,"ref_facelift_edge_face_uv","two tri found with id and sense=0",
                           0xffffffffffffffff,(long)cell_00);
                    return 1;
                  }
                  cell_00 = local_1f0[lVar7];
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < local_22c);
              if (cell_00 == -1) {
                pcVar9 = "edg tri not found with id";
                uVar5 = 0x385;
                goto LAB_001aff06;
              }
              uVar3 = ref_cell_nodes(ref_facelift->tri_cell,cell_00,(REF_INT *)&local_118);
              if (uVar3 != 0) {
                pcVar9 = "edg tri nodes";
                uVar5 = 0x387;
                goto LAB_001afe05;
              }
              local_a8 = local_118;
              local_a0 = local_110;
              local_9c = *(undefined4 *)
                          ((long)&local_118 + (long)ref_facelift->tri_cell->node_per * 4);
              uVar3 = ref_geom_find(ref_geom,local_188,2,faceid,(REF_INT *)&local_218);
              if (uVar3 == 0) {
                if (ref_geom->descr[(long)(int)local_218 * 6 + 4] < 1) {
                  if (ref_geom->descr[(long)(int)local_218 * 6 + 4] < 0) {
                    local_1c8 = 0.0;
                    pRVar4 = local_1c0;
                    goto LAB_001b01e1;
                  }
                }
                else {
                  local_1e8 = 0.0;
                  pRVar4 = local_1e0;
LAB_001b01e1:
                  *pRVar4 = 1.0;
                }
                uVar3 = ref_geom_find(ref_geom,local_184[0],2,faceid,(REF_INT *)&local_218);
                if (uVar3 == 0) {
                  if (ref_geom->descr[(long)(int)local_218 * 6 + 4] < 1) {
                    if (ref_geom->descr[(long)(int)local_218 * 6 + 4] < 0) {
                      local_1c8 = 1.0;
                      pRVar4 = local_1c0;
                      goto LAB_001b0271;
                    }
                  }
                  else {
                    local_1e8 = 1.0;
                    pRVar4 = local_1e0;
LAB_001b0271:
                    *pRVar4 = 0.0;
                  }
                  *local_228 = 0.0;
                  local_228[1] = 0.0;
                  pRVar10 = &local_188;
                  bVar2 = true;
                  do {
                    bVar6 = bVar2;
                    uVar3 = ref_geom_cell_tuv(ref_geom,*pRVar10,(REF_INT *)&local_a8,2,
                                              (REF_DBL *)&local_218,&local_1ac);
                    if (uVar3 != 0) {
                      pcVar9 = "face uv";
                      uVar5 = 0x3ab;
                      goto LAB_001afe05;
                    }
                    dVar1 = *bary_00;
                    *local_228 = *bary_01 * (double)CONCAT44(local_218._4_4_,(int)local_218) +
                                 *local_228;
                    local_228[1] = dVar1 * dStack_210 + local_228[1];
                    bary_00 = local_1e0;
                    bary_01 = local_1c0;
                    pRVar10 = local_184;
                    bVar2 = false;
                  } while (bVar6);
                  uVar3 = ref_facelift_edge_face_watertight
                                    (local_200,edgeid,faceid,0,local_1f8,local_228);
                  uVar8 = (ulong)uVar3;
                  if (uVar3 == 0) {
                    return 0;
                  }
                  pcVar9 = "facelift watertight check";
                  uVar5 = 0x3b2;
                }
                else {
                  uVar8 = (ulong)uVar3;
                  pcVar9 = "geom";
                  uVar5 = 0x39b;
                }
              }
              else {
                uVar8 = (ulong)uVar3;
                pcVar9 = "geom";
                uVar5 = 0x391;
              }
              uVar3 = (uint)uVar8;
              goto LAB_001afe07;
            }
            pcVar9 = "more then two tris for edg";
            uVar5 = 0x379;
          }
          else {
            pcVar9 = "edg nodes";
            uVar5 = 0x376;
          }
        }
        else {
          pcVar9 = "clip edge bary";
          uVar5 = 0x374;
        }
      }
      else {
        pcVar9 = "clip edge bary";
        uVar5 = 0x373;
      }
    }
    else {
      pcVar9 = "enclose";
      uVar5 = 0x371;
    }
  }
  else {
    pcVar9 = "edge uv";
    uVar5 = 0x367;
  }
LAB_001afe05:
  uVar8 = (ulong)uVar3;
LAB_001afe07:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar5,
         "ref_facelift_edge_face_uv",uVar8,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_uv(REF_FACELIFT ref_facelift,
                                             REF_INT edgeid, REF_INT faceid,
                                             REF_INT sense, REF_DBL t,
                                             REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT i, cell_node, cell, edg_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell, cells[2], edg_tri, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_DBL bary[3], clipu[3], clipv[3], faceuv[2];
  RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, uv),
      "edge uv");

  if (ref_facelift_direct(ref_facelift)) {
    if (0 != sense) {
      /* IMPLEMENT sense here, will need surrogate jump support */
      /* uses EGADS edgeUV */
      return REF_SUCCESS;
    }
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t, &cell,
                               bary),
        "enclose");
    RUS(REF_EMPTY, cell, "no enclosing found");
    RSS(ref_node_clip_bary2(bary, clipu), "clip edge bary");
    RSS(ref_node_clip_bary2(bary, clipv), "clip edge bary");
    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), cell, edg_nodes),
        "edg nodes");
    RSS(ref_cell_list_with2(ref_facelift_tri(ref_facelift), edg_nodes[0],
                            edg_nodes[1], 2, &ncell, cells),
        "more then two tris for edg");
    RAS(ncell > 0, "no tri found for edg");
    edg_tri = REF_EMPTY;
    for (i = 0; i < ncell; i++) {
      RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cells[i], tri_nodes),
          "tri nodes");
      if (faceid ==
          tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))]) {
        REIS(REF_EMPTY, edg_tri, "two tri found with id and sense=0");
        edg_tri = cells[i];
      }
    }
    RUS(REF_EMPTY, edg_tri, "edg tri not found with id");
    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), edg_tri, tri_nodes),
        "edg tri nodes");
    linear_nodes[0] = tri_nodes[0];
    linear_nodes[1] = tri_nodes[1];
    linear_nodes[2] = tri_nodes[2];
    linear_nodes[3] =
        tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];

    { /* use the opposite node free uv for degen */
      REF_INT geom;
      RSS(ref_geom_find(ref_geom, edg_nodes[0], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 0.0;
        clipv[1] = 1.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 0.0;
        clipu[1] = 1.0;
      }
      RSS(ref_geom_find(ref_geom, edg_nodes[1], REF_GEOM_FACE, faceid, &geom),
          "geom");
      if (0 < ref_geom_degen(ref_geom, geom)) {
        clipv[0] = 1.0;
        clipv[1] = 0.0;
      }
      if (0 > ref_geom_degen(ref_geom, geom)) {
        clipu[0] = 1.0;
        clipu[1] = 0.0;
      }
    }

    uv[0] = 0.0;
    uv[1] = 0.0;
    for (cell_node = 0; cell_node < 2; cell_node++) {
      RSS(ref_geom_cell_tuv(ref_geom, edg_nodes[cell_node], linear_nodes,
                            REF_GEOM_FACE, faceuv, &tuv_sense),
          "face uv");
      uv[0] += clipu[cell_node] * faceuv[0];
      uv[1] += clipv[cell_node] * faceuv[1];
    }

    RSS(ref_facelift_edge_face_watertight(ref_facelift, edgeid, faceid, sense,
                                          t, uv),
        "facelift watertight check");

  } else {
  }
  return REF_SUCCESS;
}